

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linf.c
# Opt level: O2

int linfwrt(lindef *lin,osfildef *fp)

{
  char *pcVar1;
  uint32_t tmp;
  size_t sVar2;
  uchar *__ptr;
  long lVar3;
  int iVar4;
  uchar buf [261];
  
  buf[0] = (uchar)lin->linid;
  sVar2 = strlen((char *)&lin[2].linflg);
  iVar4 = 0;
  if (sVar2 < 0x100) {
    buf[1] = (uchar)sVar2;
    buf._2_4_ = *(undefined4 *)&lin[2].linbuf;
    memcpy(buf + 6,&lin[2].linflg,sVar2);
    sVar2 = fwrite(buf,sVar2 + 6,1,(FILE *)fp);
    if (sVar2 == 1) {
      pcVar1 = lin[2].linbuf;
      if (pcVar1 != (char *)0x0) {
        iVar4 = 0;
        for (lVar3 = 0; (int)((ulong)(pcVar1 + -1) >> 10) + 1 != (int)lVar3; lVar3 = lVar3 + 1) {
          __ptr = mcmlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)((long)&lin[1].linrenp + lVar3 * 2));
          sVar2 = fwrite(__ptr,0x1000,1,(FILE *)fp);
          if (sVar2 != 1) {
            return 1;
          }
          mcmunlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)((long)&lin[1].linrenp + lVar3 * 2));
        }
      }
    }
    else {
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

int linfwrt(lindef *lin, osfildef *fp)
{
#   define  linf ((linfdef *)lin)
    uchar   buf[UCHAR_MAX + 6];
    size_t  len;
    uint    pgcnt;
    uchar  *objp;
    mcmon  *objn;

    buf[0] = lin->linid;
    len = strlen(linf->linfnam);
    if (len > UCHAR_MAX)
        return FALSE;
    buf[1] = (uchar)len;
    oswp4(buf + 2, linf->linfcrec);
    memcpy(buf + 6, linf->linfnam, (size_t)buf[1]);
    if (osfwb(fp, buf, (int)(buf[1] + 6))) return(TRUE);
    
    /* write the debug source pages */
    if (!linf->linfcrec) return(FALSE);          /* no debug records at all */
    pgcnt = 1 + ((linf->linfcrec - 1) >> 10);     /* figure number of pages */
    
    for (objn = linf->linfpg ; pgcnt ; ++objn, --pgcnt)
    {
        objp = mcmlck(linf->linfmem, *objn);
        if (osfwb(fp, objp, (1024 * DBGLINFSIZ))) return(TRUE);
        mcmunlck(linf->linfmem, *objn);
    }
    
    return(FALSE);

#   undef  linf
}